

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_database.cpp
# Opt level: O1

void __thiscall
Database_CheckInitialState_Test::~Database_CheckInitialState_Test
          (Database_CheckInitialState_Test *this)

{
  (this->super_Database).super_Test._vptr_Test = (_func_int **)&PTR__Database_002703a0;
  in_memory_store::~in_memory_store(&(this->super_Database).store_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x30);
  return;
}

Assistant:

TEST_F (Database, CheckInitialState) {
    pstore::database db{store_.file ()};
    db.set_vacuum_mode (pstore::database::vacuum_mode::disabled);

    {
        auto header = reinterpret_cast<pstore::header const *> (store_.buffer ().get ());
        EXPECT_THAT (pstore::header::file_signature1, testing::ContainerEq (header->a.signature1));
        EXPECT_EQ (pstore::header::file_signature2, header->a.signature2);

        auto const expected = std::array<std::uint16_t, 2>{
            {pstore::header::major_version, pstore::header::minor_version}};
        EXPECT_THAT (expected, testing::ContainerEq (header->a.version));
        EXPECT_EQ (sizeof (pstore::header), header->a.header_size);
        // std::uint8_t sync_name[sync_name_length];
        EXPECT_EQ (pstore::leader_size, header->footer_pos.load ().absolute ());
    }
    {
        auto footer = reinterpret_cast<pstore::trailer const *> (store_.buffer ().get () +
                                                                 pstore::leader_size);

        EXPECT_THAT (pstore::trailer::default_signature1,
                     testing::ContainerEq (footer->a.signature1));
        EXPECT_EQ (0U, footer->a.generation);
        EXPECT_EQ (0U, footer->a.size);
        EXPECT_EQ (pstore::typed_address<pstore::trailer>::null (), footer->a.prev_generation);
        EXPECT_THAT (pstore::trailer::default_signature2,
                     testing::ContainerEq (footer->signature2));
    }
}